

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::ResultCollector::addResult
          (ResultCollector *this,qpTestResult result,char *msg)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1a0;
  char *local_20;
  char *msg_local;
  ResultCollector *pRStack_10;
  qpTestResult result_local;
  ResultCollector *this_local;
  
  local_20 = msg;
  msg_local._4_4_ = result;
  pRStack_10 = this;
  tcu::TestLog::operator<<(&local_1a0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [10])"// Fail: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_20);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  if (this->m_result == QP_TEST_RESULT_PASS) {
    this->m_result = msg_local._4_4_;
    this->m_message = local_20;
  }
  else {
    if (msg_local._4_4_ == QP_TEST_RESULT_FAIL) {
      this->m_result = QP_TEST_RESULT_FAIL;
    }
    this->m_message = "Multiple problems, see log for details";
  }
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const char* msg)
{
	m_log << TestLog::Message << "// Fail: " << msg << TestLog::EndMessage;
	if (m_result == QP_TEST_RESULT_PASS)
	{
		m_result = result;
		m_message = msg;
	}
	else
	{
		if (result == QP_TEST_RESULT_FAIL)
			m_result = result;
		m_message = "Multiple problems, see log for details";
	}
}